

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_align_bits(DisasContext_conflict6 *ctx,int wordsz,int rd,int rs,int rt,int bits)

{
  TCGTemp *pTVar1;
  TCGTemp *a1;
  TCGv_i64 pTVar2;
  TCGv_i64 pTVar3;
  TCGOpcode TVar4;
  TCGContext_conflict6 *tcg_ctx;
  uintptr_t o_4;
  TCGv_i64 ret;
  uintptr_t o_3;
  
  if (rd == 0) {
    return;
  }
  pTVar1 = tcg_temp_new_internal_mips64el((TCGContext_conflict6 *)ctx,TCG_TYPE_I64,false);
  ret = (TCGv_i64)((long)pTVar1 - (long)ctx);
  if (bits != 0 && bits != wordsz) {
    a1 = tcg_temp_new_internal_mips64el((TCGContext_conflict6 *)ctx,TCG_TYPE_I64,false);
    if (rt == 0) {
      TVar4 = INDEX_op_movi_i64;
      pTVar2 = (TCGv_i64)0x0;
LAB_0098e329:
      tcg_gen_op2_mips64el((TCGContext_conflict6 *)ctx,TVar4,(TCGArg)pTVar1,(TCGArg)pTVar2);
    }
    else if (*(TCGv_i64 *)(&ctx[0xf9].gi + (long)rt * 2) != ret) {
      pTVar2 = *(TCGv_i64 *)(&ctx[0xf9].gi + (long)rt * 2) + (long)ctx;
      TVar4 = INDEX_op_mov_i64;
      goto LAB_0098e329;
    }
    pTVar2 = (TCGv_i64)((long)a1 - (long)ctx);
    if (rs == 0) {
      TVar4 = INDEX_op_movi_i64;
      pTVar3 = (TCGv_i64)0x0;
LAB_0098e3b1:
      tcg_gen_op2_mips64el((TCGContext_conflict6 *)ctx,TVar4,(TCGArg)a1,(TCGArg)pTVar3);
    }
    else if (*(TCGv_i64 *)(&ctx[0xf9].gi + (long)rs * 2) != pTVar2) {
      pTVar3 = *(TCGv_i64 *)(&ctx[0xf9].gi + (long)rs * 2) + (long)ctx;
      TVar4 = INDEX_op_mov_i64;
      goto LAB_0098e3b1;
    }
    if (wordsz == 0x40) {
      tcg_gen_shli_i64_mips64el((TCGContext_conflict6 *)ctx,ret,ret,(long)bits);
      tcg_gen_shri_i64_mips64el((TCGContext_conflict6 *)ctx,pTVar2,pTVar2,(long)(0x40 - bits));
      tcg_gen_op3_mips64el
                ((TCGContext_conflict6 *)ctx,INDEX_op_or_i64,
                 (long)&(ctx->base).tb + *(long *)(&ctx[0xf9].gi + (ulong)(uint)rd * 2),(TCGArg)a1,
                 (TCGArg)pTVar1);
    }
    else if (wordsz == 0x20) {
      pTVar1 = tcg_temp_new_internal_mips64el((TCGContext_conflict6 *)ctx,TCG_TYPE_I64,false);
      pTVar3 = (TCGv_i64)((long)pTVar1 - (long)ctx);
      tcg_gen_deposit_i64_mips64el((TCGContext_conflict6 *)ctx,pTVar3,pTVar2,ret,0x20,0x20);
      tcg_gen_shri_i64_mips64el((TCGContext_conflict6 *)ctx,pTVar3,pTVar3,(long)(0x20 - bits));
      tcg_gen_ext32s_i64_mips64el
                ((TCGContext_conflict6 *)ctx,*(TCGv_i64 *)(&ctx[0xf9].gi + (ulong)(uint)rd * 2),
                 pTVar3);
      tcg_temp_free_internal_mips64el((TCGContext_conflict6 *)ctx,pTVar1);
    }
    tcg_temp_free_internal_mips64el((TCGContext_conflict6 *)ctx,(TCGTemp *)(pTVar2 + (long)ctx));
    goto LAB_0098e4c9;
  }
  if (bits == 0) {
    if (rt != 0) goto LAB_0098e2fd;
LAB_0098e35f:
    TVar4 = INDEX_op_movi_i64;
    pTVar2 = (TCGv_i64)0x0;
LAB_0098e36d:
    tcg_gen_op2_mips64el((TCGContext_conflict6 *)ctx,TVar4,(TCGArg)pTVar1,(TCGArg)pTVar2);
  }
  else {
    rt = rs;
    if (rs == 0) goto LAB_0098e35f;
LAB_0098e2fd:
    if (*(TCGv_i64 *)(&ctx[0xf9].gi + (long)rt * 2) != ret) {
      pTVar2 = *(TCGv_i64 *)(&ctx[0xf9].gi + (long)rt * 2) + (long)ctx;
      TVar4 = INDEX_op_mov_i64;
      goto LAB_0098e36d;
    }
  }
  if (wordsz == 0x40) {
    if (*(TCGv_i64 *)(&ctx[0xf9].gi + (ulong)(uint)rd * 2) != ret) {
      tcg_gen_op2_mips64el
                ((TCGContext_conflict6 *)ctx,INDEX_op_mov_i64,
                 (TCGArg)(*(TCGv_i64 *)(&ctx[0xf9].gi + (ulong)(uint)rd * 2) + (long)ctx),
                 (TCGArg)pTVar1);
    }
  }
  else if (wordsz == 0x20) {
    tcg_gen_ext32s_i64_mips64el
              ((TCGContext_conflict6 *)ctx,*(TCGv_i64 *)(&ctx[0xf9].gi + (ulong)(uint)rd * 2),ret);
  }
LAB_0098e4c9:
  tcg_temp_free_internal_mips64el((TCGContext_conflict6 *)ctx,(TCGTemp *)(ret + (long)ctx));
  return;
}

Assistant:

static void gen_align_bits(DisasContext *ctx, int wordsz, int rd, int rs,
                           int rt, int bits)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0;
    if (rd == 0) {
        /* Treat as NOP. */
        return;
    }
    t0 = tcg_temp_new(tcg_ctx);
    if (bits == 0 || bits == wordsz) {
        if (bits == 0) {
            gen_load_gpr(tcg_ctx, t0, rt);
        } else {
            gen_load_gpr(tcg_ctx, t0, rs);
        }
        switch (wordsz) {
        case 32:
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0);
            break;
#if defined(TARGET_MIPS64)
        case 64:
            tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0);
            break;
#endif
        }
    } else {
        TCGv t1 = tcg_temp_new(tcg_ctx);
        gen_load_gpr(tcg_ctx, t0, rt);
        gen_load_gpr(tcg_ctx, t1, rs);
        switch (wordsz) {
        case 32:
            {
                TCGv_i64 t2 = tcg_temp_new_i64(tcg_ctx);
                tcg_gen_concat_tl_i64(tcg_ctx, t2, t1, t0);
                tcg_gen_shri_i64(tcg_ctx, t2, t2, 32 - bits);
                gen_move_low32(tcg_ctx, tcg_ctx->cpu_gpr[rd], t2);
                tcg_temp_free_i64(tcg_ctx, t2);
            }
            break;
#if defined(TARGET_MIPS64)
        case 64:
            tcg_gen_shli_tl(tcg_ctx, t0, t0, bits);
            tcg_gen_shri_tl(tcg_ctx, t1, t1, 64 - bits);
            tcg_gen_or_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t1, t0);
            break;
#endif
        }
        tcg_temp_free(tcg_ctx, t1);
    }

    tcg_temp_free(tcg_ctx, t0);
}